

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

int __thiscall minihttp::TcpSocket::close(TcpSocket *this,int __fd)

{
  TcpSocket *this_local;
  
  if (this->_s != -1) {
    (*this->_vptr_TcpSocket[3])();
    ::close((int)this->_s);
    this->_s = -1;
    this->_recvSize = 0;
  }
  return (int)this;
}

Assistant:

void TcpSocket::close(void)
{
    if(!SOCKETVALID(_s))
        return;

    traceprint("TcpSocket::close\n");

    _OnCloseInternal();

#ifdef MINIHTTP_USE_MBEDTLS
    if(_sslctx)
        ((SSLCtx*)_sslctx)->reset();
    mbedtls_net_free((mbedtls_net_context*)&_s);
    shutdownSSL();
#else
#  ifdef _WIN32
    ::closesocket((SOCKET)_s);
#  else
    ::close(_s);
#  endif
#endif

    _s = INVALID_SOCKET;
    _recvSize = 0;
}